

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

Vector3D * __thiscall CMU462::Face::normal(Vector3D *__return_storage_ptr__,Face *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  double dVar6;
  double dVar7;
  double dVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  double dVar11;
  _List_node_base *p_Var12;
  
  p_Var2 = (this->_halfedge)._M_node;
  p_Var12 = p_Var2[2]._M_prev;
  dVar7 = 0.0;
  dVar8 = 0.0;
  dVar6 = 0.0;
  p_Var5 = p_Var2;
  p_Var9 = p_Var12[1]._M_prev;
  p_Var10 = p_Var12[2]._M_next;
  p_Var12 = p_Var12[2]._M_prev;
  do {
    p_Var5 = p_Var5[2]._M_next;
    p_Var3 = p_Var5[2]._M_prev;
    p_Var1 = p_Var3[1]._M_prev;
    p_Var4 = p_Var3[2]._M_next;
    p_Var3 = p_Var3[2]._M_prev;
    dVar7 = dVar7 + ((double)p_Var3 * (double)p_Var10 - (double)p_Var12 * (double)p_Var4);
    dVar8 = dVar8 + ((double)p_Var1 * (double)p_Var12 - (double)p_Var9 * (double)p_Var3);
    dVar6 = dVar6 + ((double)p_Var9 * (double)p_Var4 - (double)p_Var10 * (double)p_Var1);
    p_Var9 = p_Var1;
    p_Var10 = p_Var4;
    p_Var12 = p_Var3;
  } while (p_Var5 != p_Var2);
  dVar11 = 1.0 / SQRT(dVar6 * dVar6 + dVar7 * dVar7 + dVar8 * dVar8);
  __return_storage_ptr__->x = dVar11 * dVar7;
  __return_storage_ptr__->y = dVar11 * dVar8;
  __return_storage_ptr__->z = dVar6 * dVar11;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Face::normal() const {
    Vector3D N(0., 0., 0.);

    HalfedgeCIter h = halfedge();
    do {
      Vector3D pi = h->vertex()->position;
      Vector3D pj = h->next()->vertex()->position;

      N += cross(pi, pj);

      h = h->next();
    } while (h != halfedge());

    return N.unit();
  }